

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::ObjectInstance(FormattingScene *this,string *name,FileLoc loc)

{
  iterator iVar1;
  mapped_type *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->upgrade == true) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->definedObjectInstances)._M_t,name);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->definedObjectInstances)._M_t._M_impl.super__Rb_tree_header) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_38,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc)
      ;
      Printf<std::__cxx11::string,std::__cxx11::string_const&>
                ("%sObjectInstance \"%s\"\n",&local_38,name);
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_38,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc)
      ;
      args_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->definedObjectInstances,name);
      Printf<std::__cxx11::string,std::__cxx11::string&>
                ("%sObjectInstance \"%s\"\n",&local_38,args_1);
    }
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_38,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sObjectInstance \"%s\"\n",&local_38,name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::ObjectInstance(const std::string &name, FileLoc loc) {
    if (upgrade) {
        if (definedObjectInstances.find(name) == definedObjectInstances.end())
            // this is legit if we're upgrading multiple files separately...
            Printf("%sObjectInstance \"%s\"\n", indent(), name);
        else
            // use the most recent renaming of it
            Printf("%sObjectInstance \"%s\"\n", indent(), definedObjectInstances[name]);
    } else
        Printf("%sObjectInstance \"%s\"\n", indent(), name);
}